

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  unsigned_long *puVar1;
  cmGlobalUnixMakefileGenerator3 *this_00;
  pointer pbVar2;
  cmGeneratorTarget *pcVar3;
  cmMakefile *pcVar4;
  pointer pcVar5;
  cmLocalUnixMakefileGenerator3 *pcVar6;
  bool relink_00;
  undefined4 uVar7;
  size_type sVar8;
  bool bVar9;
  bool useResponseFile;
  bool forResponse;
  bool useWatcomQuote;
  int iVar10;
  LinkClosure *pLVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  char *pcVar13;
  string *psVar14;
  long *plVar15;
  string *psVar16;
  cmLinkLineComputer *this_01;
  undefined4 extraout_var;
  size_type *psVar17;
  undefined7 in_register_00000031;
  cmOutputConverter *pcVar18;
  string *real_link_command;
  pointer pbVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  pointer pbVar21;
  cmRulePlaceholderExpander *local_408;
  undefined4 local_3fc;
  string targetFullPathCompilePDB;
  string flags;
  string linkLanguage;
  string linkFlags;
  string linkRuleVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string targetOutputReal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  string target;
  string linkLibs;
  string local_2b8;
  string launcher;
  string objExt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string buildObjs;
  string cuda_lang;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string objectDir;
  string targetOutPathCompilePDB;
  string linkRule;
  
  this_00 = (this->super_cmMakefileTargetGenerator).GlobalGenerator;
  paVar20 = &__str.field_2;
  __str._M_dataplus._M_p = (pointer)paVar20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CUDA","");
  bVar9 = cmGlobalGenerator::GetLanguageEnabled((cmGlobalGenerator *)this_00,&__str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar20) {
    operator_delete(__str._M_dataplus._M_p,
                    CONCAT71(__str.field_2._M_allocated_capacity._1_7_,__str.field_2._M_local_buf[0]
                            ) + 1);
  }
  if (bVar9) {
    local_3fc = (undefined4)CONCAT71(in_register_00000031,relink);
    cuda_lang._M_dataplus._M_p = (pointer)&cuda_lang.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cuda_lang,"CUDA","");
    psVar16 = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
    pLVar11 = cmGeneratorTarget::GetLinkClosure
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget,psVar16);
    _Var12 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       ((pLVar11->Languages).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pLVar11->Languages).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&cuda_lang);
    pbVar2 = (pLVar11->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    __str._M_dataplus._M_p = (pointer)paVar20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__str,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
    pcVar13 = cmGeneratorTarget::GetProperty(pcVar3,&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar20) {
      operator_delete(__str._M_dataplus._M_p,
                      CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                               __str.field_2._M_local_buf[0]) + 1);
    }
    if (pcVar13 == (char *)0x0) {
      bVar9 = true;
    }
    else {
      bVar9 = cmSystemTools::IsOn(pcVar13);
    }
    if (bVar9 == true && _Var12._M_current != pbVar2) {
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"CUDA","");
      pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      __str._M_dataplus._M_p = (pointer)paVar20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__str,"CMAKE_CUDA_OUTPUT_EXTENSION","");
      psVar14 = cmMakefile::GetSafeDefinition(pcVar4,&__str);
      objExt._M_dataplus._M_p = (pointer)&objExt.field_2;
      pcVar5 = (psVar14->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&objExt,pcVar5,pcVar5 + psVar14->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar20) {
        operator_delete(__str._M_dataplus._M_p,
                        CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                 __str.field_2._M_local_buf[0]) + 1);
      }
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmMakefileTargetGenerator::AppendLinkDepends
                (&this->super_cmMakefileTargetGenerator,&depends,&linkLanguage);
      pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
      ;
      pcVar5 = (pcVar3->ObjectDirectory)._M_dataplus._M_p;
      __str._M_dataplus._M_p = (pointer)paVar20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar5,pcVar5 + (pcVar3->ObjectDirectory)._M_string_length);
      std::__cxx11::string::append((char *)&__str);
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&__str,(ulong)objExt._M_dataplus._M_p);
      targetOutputReal._M_dataplus._M_p = (pointer)&targetOutputReal.field_2;
      psVar17 = (size_type *)(plVar15 + 2);
      if ((size_type *)*plVar15 == psVar17) {
        targetOutputReal.field_2._M_allocated_capacity = *psVar17;
        targetOutputReal.field_2._8_8_ = plVar15[3];
      }
      else {
        targetOutputReal.field_2._M_allocated_capacity = *psVar17;
        targetOutputReal._M_dataplus._M_p = (pointer)*plVar15;
      }
      targetOutputReal._M_string_length = plVar15[1];
      *plVar15 = (long)psVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar20) {
        operator_delete(__str._M_dataplus._M_p,
                        CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                 __str.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::_M_assign((string *)&this->DeviceLinkObject);
      puVar1 = &(this->super_cmMakefileTargetGenerator).NumberOfProgressActions;
      *puVar1 = *puVar1 + 1;
      if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
        __str._M_string_length = 0;
        __str.field_2._M_local_buf[0] = '\0';
        __str._M_dataplus._M_p = (pointer)paVar20;
        cmMakefileTargetGenerator::MakeEchoProgress
                  (&this->super_cmMakefileTargetGenerator,(EchoProgress *)&__str);
        flags._M_dataplus._M_p = (pointer)&flags.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&flags,"Linking ","");
        std::__cxx11::string::_M_append((char *)&flags,(ulong)linkLanguage._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&flags);
        pcVar6 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
        psVar14 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar6)
        ;
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&linkRuleVar,(cmLocalGenerator *)pcVar6,psVar14,&this->DeviceLinkObject);
        cmOutputConverter::ConvertToOutputFormat
                  (&linkFlags,
                   &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&linkRuleVar,SHELL);
        std::__cxx11::string::_M_append((char *)&flags,(ulong)linkFlags._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
          operator_delete(linkFlags._M_dataplus._M_p,
                          CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                                   linkFlags.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkRuleVar._M_dataplus._M_p != &linkRuleVar.field_2) {
          operator_delete(linkRuleVar._M_dataplus._M_p,linkRuleVar.field_2._M_allocated_capacity + 1
                         );
        }
        cmLocalUnixMakefileGenerator3::AppendEcho
                  ((this->super_cmMakefileTargetGenerator).LocalGenerator,&commands,&flags,EchoLink,
                   (EchoProgress *)&__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)flags._M_dataplus._M_p != &flags.field_2) {
          operator_delete(flags._M_dataplus._M_p,
                          CONCAT71(flags.field_2._M_allocated_capacity._1_7_,
                                   flags.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar20) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                   __str.field_2._M_local_buf[0]) + 1);
        }
      }
      flags._M_dataplus._M_p = (pointer)&flags.field_2;
      flags._M_string_length = 0;
      flags.field_2._M_local_buf[0] = '\0';
      linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
      linkFlags._M_string_length = 0;
      linkFlags.field_2._M_local_buf[0] = '\0';
      bVar9 = cmGeneratorTarget::IsExecutableWithExports
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget);
      if (bVar9) {
        __str._M_dataplus._M_p = (pointer)paVar20;
        std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"CMAKE_EXE_EXPORTS_","");
        std::__cxx11::string::_M_append((char *)&__str,(ulong)linkLanguage._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&__str);
        pcVar6 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
        pcVar13 = cmMakefile::GetDefinition
                            ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                             Makefile,&__str);
        (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
                  (pcVar6,&linkFlags,pcVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar20) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                   __str.field_2._M_local_buf[0]) + 1);
        }
      }
      pcVar6 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      cmLocalGenerator::GetLinkLibsCMP0065
                (&__str,(cmLocalGenerator *)pcVar6,&linkLanguage,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget);
      (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar6,&linkFlags,&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar20) {
        operator_delete(__str._M_dataplus._M_p,
                        CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                 __str.field_2._M_local_buf[0]) + 1);
      }
      cmLocalGenerator::AddLanguageFlagsForLinking
                ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,&flags,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,&linkLanguage,psVar16);
      cmLocalGenerator::AddArchitectureFlags
                ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,&flags,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,&linkLanguage,psVar16);
      cmMakefileTargetGenerator::GetTargetLinkFlags
                (&this->super_cmMakefileTargetGenerator,&linkFlags,&linkLanguage);
      exeCleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      exeCleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      exeCleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar6 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar16 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar6);
      cmLocalGenerator::MaybeConvertToRelativePath
                (&__str,(cmLocalGenerator *)pcVar6,psVar16,&targetOutputReal);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&exeCleanFiles
                 ,&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar20) {
        operator_delete(__str._M_dataplus._M_p,
                        CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                 __str.field_2._M_local_buf[0]) + 1);
      }
      bVar9 = (((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
              super_cmGlobalCommonGenerator).super_cmGlobalGenerator.UseLinkScript;
      real_link_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      real_link_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      real_link_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      linkRuleVar._M_dataplus._M_p = (pointer)&linkRuleVar.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&linkRuleVar,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE","");
      cmMakefileTargetGenerator::GetLinkRule
                (&linkRule,&this->super_cmMakefileTargetGenerator,&linkRuleVar);
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&linkRule,&real_link_commands,false);
      useResponseFile =
           cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                     (&this->super_cmMakefileTargetGenerator,&linkLanguage);
      forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                              (&this->super_cmMakefileTargetGenerator,&linkLanguage);
      pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      __str._M_dataplus._M_p = (pointer)paVar20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,linkRuleVar._M_dataplus._M_p,
                 linkRuleVar._M_dataplus._M_p + linkRuleVar._M_string_length);
      std::__cxx11::string::append((char *)&__str);
      useWatcomQuote = cmMakefile::IsOn(pcVar4,&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar20) {
        operator_delete(__str._M_dataplus._M_p,
                        CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                 __str.field_2._M_local_buf[0]) + 1);
      }
      cmOutputConverter::SetLinkScriptShell
                (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                  super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,bVar9
                );
      this_01 = (cmLinkLineComputer *)operator_new(0x40);
      pcVar6 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar18 = &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      if (pcVar6 == (cmLocalUnixMakefileGenerator3 *)0x0) {
        pcVar18 = (cmOutputConverter *)0x0;
      }
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&linkLibs,(cmLocalGenerator *)pcVar6);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&__str,(cmStateSnapshot *)&linkLibs);
      cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
                ((cmLinkLineDeviceComputer *)this_01,pcVar18,(cmStateDirectory *)&__str);
      cmLinkLineComputer::SetForResponse(this_01,forResponse);
      cmLinkLineComputer::SetUseWatcomQuote(this_01,useWatcomQuote);
      relink_00 = local_3fc._0_1_;
      cmLinkLineComputer::SetRelink(this_01,local_3fc._0_1_);
      linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
      linkLibs._M_string_length = 0;
      linkLibs.field_2._M_local_buf[0] = '\0';
      cmMakefileTargetGenerator::CreateLinkLibs
                (&this->super_cmMakefileTargetGenerator,this_01,&linkLibs,forResponse,&depends);
      buildObjs._M_dataplus._M_p = (pointer)&buildObjs.field_2;
      buildObjs._M_string_length = 0;
      buildObjs.field_2._M_local_buf[0] = '\0';
      cmMakefileTargetGenerator::CreateObjectLists
                (&this->super_cmMakefileTargetGenerator,bVar9,false,useResponseFile,&buildObjs,
                 &depends,useWatcomQuote);
      cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)&__str);
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                (&objectDir,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget);
      pcVar6 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar16 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar6);
      cmLocalGenerator::MaybeConvertToRelativePath
                (&targetFullPathCompilePDB,(cmLocalGenerator *)pcVar6,psVar16,&objectDir);
      cmOutputConverter::ConvertToOutputFormat
                (&target,&(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          super_cmOutputConverter,&targetFullPathCompilePDB,SHELL);
      std::__cxx11::string::operator=((string *)&objectDir,(string *)&target);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)target._M_dataplus._M_p != &target.field_2) {
        operator_delete(target._M_dataplus._M_p,target.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetFullPathCompilePDB._M_dataplus._M_p != &targetFullPathCompilePDB.field_2) {
        operator_delete(targetFullPathCompilePDB._M_dataplus._M_p,
                        targetFullPathCompilePDB.field_2._M_allocated_capacity + 1);
      }
      pcVar6 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar16 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar6);
      cmLocalGenerator::MaybeConvertToRelativePath
                (&targetFullPathCompilePDB,(cmLocalGenerator *)pcVar6,psVar16,&targetOutputReal);
      cmOutputConverter::ConvertToOutputFormat
                (&target,&(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          super_cmOutputConverter,&targetFullPathCompilePDB,(uint)useWatcomQuote);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetFullPathCompilePDB._M_dataplus._M_p != &targetFullPathCompilePDB.field_2) {
        operator_delete(targetFullPathCompilePDB._M_dataplus._M_p,
                        targetFullPathCompilePDB.field_2._M_allocated_capacity + 1);
      }
      cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
                (&targetFullPathCompilePDB,(cmCommonTargetGenerator *)this);
      cmOutputConverter::ConvertToOutputFormat
                (&targetOutPathCompilePDB,
                 &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                  super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
                 &targetFullPathCompilePDB,SHELL);
      __str.field_2._8_8_ = targetOutPathCompilePDB._M_dataplus._M_p;
      launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
      launcher._M_string_length = 0;
      launcher.field_2._M_local_buf[0] = '\0';
      pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
      ;
      pcVar6 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      paVar20 = &local_2b8.field_2;
      local_2b8._M_dataplus._M_p = (pointer)paVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"RULE_LAUNCH_LINK","");
      pcVar13 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar6,pcVar3,&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != paVar20) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      sVar8 = launcher._M_string_length;
      if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
        strlen(pcVar13);
        std::__cxx11::string::_M_replace((ulong)&launcher,0,(char *)sVar8,(ulong)pcVar13);
        std::__cxx11::string::append((char *)&launcher);
      }
      iVar10 = (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                 super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
      local_408 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar10);
      std::__cxx11::string::_M_assign((string *)local_408);
      pbVar2 = real_link_commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (real_link_commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          real_link_commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar19 = real_link_commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::operator+(&local_2b8,&launcher,pbVar19);
          std::__cxx11::string::operator=((string *)pbVar19,(string *)&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != paVar20) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          pcVar6 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
          pcVar18 = &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
          if (pcVar6 == (cmLocalUnixMakefileGenerator3 *)0x0) {
            pcVar18 = (cmOutputConverter *)0x0;
          }
          cmRulePlaceholderExpander::ExpandRuleVariables
                    (local_408,pcVar18,pbVar19,(RuleVariables *)&__str);
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 != pbVar2);
      }
      cmOutputConverter::SetLinkScriptShell
                (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                  super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,false
                );
      uVar7 = local_3fc;
      if (local_408 != (cmRulePlaceholderExpander *)0x0) {
        std::default_delete<cmRulePlaceholderExpander>::operator()
                  ((default_delete<cmRulePlaceholderExpander> *)&local_408,local_408);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)launcher._M_dataplus._M_p != &launcher.field_2) {
        operator_delete(launcher._M_dataplus._M_p,
                        CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                                 launcher.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetOutPathCompilePDB._M_dataplus._M_p != &targetOutPathCompilePDB.field_2) {
        operator_delete(targetOutPathCompilePDB._M_dataplus._M_p,
                        targetOutPathCompilePDB.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetFullPathCompilePDB._M_dataplus._M_p != &targetFullPathCompilePDB.field_2) {
        operator_delete(targetFullPathCompilePDB._M_dataplus._M_p,
                        targetFullPathCompilePDB.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)target._M_dataplus._M_p != &target.field_2) {
        operator_delete(target._M_dataplus._M_p,target.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
        operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)buildObjs._M_dataplus._M_p != &buildObjs.field_2) {
        operator_delete(buildObjs._M_dataplus._M_p,
                        CONCAT71(buildObjs.field_2._M_allocated_capacity._1_7_,
                                 buildObjs.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
        operator_delete(linkLibs._M_dataplus._M_p,
                        CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                 linkLibs.field_2._M_local_buf[0]) + 1);
      }
      (*this_01->_vptr_cmLinkLineComputer[1])(this_01);
      if (bVar9 == false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&commands1,&real_link_commands);
      }
      else {
        pcVar13 = "dlink.txt";
        if ((char)uVar7 != '\0') {
          pcVar13 = "drelink.txt";
        }
        cmMakefileTargetGenerator::CreateLinkScript
                  (&this->super_cmMakefileTargetGenerator,pcVar13,&real_link_commands,&commands1,
                   &depends);
      }
      pcVar6 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar16 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                          ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           Makefile);
      psVar14 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)
                           (this->super_cmMakefileTargetGenerator).LocalGenerator);
      cmLocalUnixMakefileGenerator3::CreateCDCommand(pcVar6,&commands1,psVar16,psVar14);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 commands1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 commands1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pbVar19 = commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (commands1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          commands1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar20 = &(commands1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar15 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar20 + -1))->_M_dataplus)._M_p;
          if (paVar20 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar15) {
            operator_delete(plVar15,paVar20->_M_allocated_capacity + 1);
          }
          pbVar21 = (pointer)(paVar20 + 1);
          paVar20 = paVar20 + 2;
        } while (pbVar21 != pbVar19);
        commands1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
      }
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
                 &targetOutputReal,&depends,&commands,false,false);
      cmMakefileTargetGenerator::WriteTargetDriverRule
                (&this->super_cmMakefileTargetGenerator,&targetOutputReal,relink_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(this->super_cmMakefileTargetGenerator).CleanFiles,
                 (this->super_cmMakefileTargetGenerator).CleanFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 exeCleanFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 exeCleanFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkRule._M_dataplus._M_p != &linkRule.field_2) {
        operator_delete(linkRule._M_dataplus._M_p,linkRule.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkRuleVar._M_dataplus._M_p != &linkRuleVar.field_2) {
        operator_delete(linkRuleVar._M_dataplus._M_p,linkRuleVar.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&real_link_commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&exeCleanFiles);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
        operator_delete(linkFlags._M_dataplus._M_p,
                        CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                                 linkFlags.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)flags._M_dataplus._M_p != &flags.field_2) {
        operator_delete(flags._M_dataplus._M_p,
                        CONCAT71(flags.field_2._M_allocated_capacity._1_7_,
                                 flags.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetOutputReal._M_dataplus._M_p != &targetOutputReal.field_2) {
        operator_delete(targetOutputReal._M_dataplus._M_p,
                        targetOutputReal.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objExt._M_dataplus._M_p != &objExt.field_2) {
        operator_delete(objExt._M_dataplus._M_p,objExt.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
        operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1
                       );
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cuda_lang._M_dataplus._M_p != &cuda_lang.field_2) {
      operator_delete(cuda_lang._M_dataplus._M_p,cuda_lang.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule(
  bool relink)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (!this->GlobalGenerator->GetLanguageEnabled("CUDA")) {
    return;
  }

  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    this->GeneratorTarget->GetLinkClosure(this->ConfigName);

  const bool hasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());

  bool doDeviceLinking = true;
  if (const char* resolveDeviceSymbols =
        this->GeneratorTarget->GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    doDeviceLinking = cmSystemTools::IsOn(resolveDeviceSymbols);
  }
  if (!hasCUDA || !doDeviceLinking) {
    return;
  }

  std::vector<std::string> commands;

  // Get the language to use for linking this library.
  std::string linkLanguage = "CUDA";
  std::string const objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Get the name of the device object to generate.
  std::string const targetOutputReal =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutputReal;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = "Linking ";
    buildEcho += linkLanguage;
    buildEcho += " device code ";
    buildEcho += this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(),
        this->DeviceLinkObject),
      cmOutputConverter::SHELL);
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }

  // Build a list of compiler flags and linker flags.
  std::string flags;
  std::string linkFlags;

  // Add flags to create an executable.
  // Add symbol export flags if necessary.
  if (this->GeneratorTarget->IsExecutableWithExports()) {
    std::string export_flag_var = "CMAKE_EXE_EXPORTS_";
    export_flag_var += linkLanguage;
    export_flag_var += "_FLAG";
    this->LocalGenerator->AppendFlags(
      linkFlags, this->Makefile->GetDefinition(export_flag_var));
  }

  this->LocalGenerator->AppendFlags(linkFlags,
                                    this->LocalGenerator->GetLinkLibsCMP0065(
                                      linkLanguage, *this->GeneratorTarget));

  // Add language feature flags.
  this->LocalGenerator->AddLanguageFlagsForLinking(
    flags, this->GeneratorTarget, linkLanguage, this->ConfigName);

  this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                             linkLanguage, this->ConfigName);

  // Add target-specific linker flags.
  this->GetTargetLinkFlags(linkFlags, linkLanguage);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(this->LocalGenerator->MaybeConvertToRelativePath(
    this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  std::vector<std::string> real_link_commands;
  const std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE";
  const std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmSystemTools::ExpandListArgument(linkRule, real_link_commands);

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  // Expand the rule variables.
  {
    bool useWatcomQuote =
      this->Makefile->IsOn(linkRuleVar + "_USE_WATCOM_QUOTE");

    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    std::unique_ptr<cmLinkLineComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetUseWatcomQuote(useWatcomQuote);
    linkLineComputer->SetRelink(relink);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    this->CreateLinkLibs(linkLineComputer.get(), linkLibs,
                         useResponseFileForLibs, depends);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(useLinkScript, false, useResponseFileForObjects,
                            buildObjs, depends, useWatcomQuote);

    cmRulePlaceholderExpander::RuleVariables vars;
    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();

    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), objectDir),
      cmOutputConverter::SHELL);

    cmOutputConverter::OutputFormat output = (useWatcomQuote)
      ? cmOutputConverter::WATCOMQUOTE
      : cmOutputConverter::SHELL;
    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal),
      output);

    std::string targetFullPathCompilePDB = this->ComputeTargetCompilePDB();
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Language = linkLanguage.c_str();
    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.Flags = flags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;

    const char* val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->LocalGenerator->CreateRulePlaceholderExpander());

    // Expand placeholders in the commands.
    rulePlaceholderExpander->SetTargetImpLib(targetOutputReal);
    for (std::string& real_link_command : real_link_commands) {
      real_link_command = launcher + real_link_command;
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }

    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  commands.insert(commands.end(), commands1.begin(), commands1.end());
  commands1.clear();

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      targetOutputReal, depends, commands,
                                      false);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutputReal, relink);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(this->CleanFiles.end(), exeCleanFiles.begin(),
                          exeCleanFiles.end());
#else
  static_cast<void>(relink);
#endif
}